

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O1

void __thiscall FGLRenderer::ProcessScene(FGLRenderer *this,bool toscreen)

{
  short sVar1;
  subsector_t *psVar2;
  
  FDrawInfo::StartDrawInfo();
  draw_dlightf = 0;
  draw_dlight = 0;
  iter_dlight = 0;
  iter_dlightf = 0;
  GLPortal::BeginScene();
  psVar2 = R_PointInSubsector(SUB84(ViewPos.X + 103079215104.0,0),
                              SUB84(ViewPos.Y + 103079215104.0,0));
  sVar1 = psVar2->mapsection;
  memset(currentmapsection.Array,0,(ulong)currentmapsection.Count);
  currentmapsection.Array[(short)((uint)(int)sVar1 >> 3)] =
       currentmapsection.Array[(short)((uint)(int)sVar1 >> 3)] | (byte)(1 << ((byte)sVar1 & 7));
  DrawScene(this,(uint)!toscreen);
  FDrawInfo::EndDrawInfo();
  return;
}

Assistant:

void FGLRenderer::ProcessScene(bool toscreen)
{
	FDrawInfo::StartDrawInfo();
	iter_dlightf = iter_dlight = draw_dlight = draw_dlightf = 0;
	GLPortal::BeginScene();

	int mapsection = R_PointInSubsector(ViewPos)->mapsection;
	memset(&currentmapsection[0], 0, currentmapsection.Size());
	currentmapsection[mapsection>>3] |= 1 << (mapsection & 7);
	DrawScene(toscreen ? DM_MAINVIEW : DM_OFFSCREEN);
	FDrawInfo::EndDrawInfo();

}